

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_catalog.cpp
# Opt level: O1

void __thiscall
duckdb::DuckCatalog::ScanSchemas
          (DuckCatalog *this,function<void_(duckdb::SchemaCatalogEntry_&)> *callback)

{
  pointer this_00;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  this_00 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::
            operator->(&this->schemas);
  local_28._8_8_ = 0;
  pcStack_10 = ::std::
               _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/duck_catalog.cpp:119:16)>
               ::_M_invoke;
  local_18 = ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/duck_catalog.cpp:119:16)>
             ::_M_manager;
  local_28._M_unused._M_object = callback;
  CatalogSet::Scan(this_00,(function<void_(duckdb::CatalogEntry_&)> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void DuckCatalog::ScanSchemas(std::function<void(SchemaCatalogEntry &)> callback) {
	schemas->Scan([&](CatalogEntry &entry) { callback(entry.Cast<SchemaCatalogEntry>()); });
}